

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

char * __thiscall
sentencepiece::ModelProto_SentencePiece::_InternalParse
          (ModelProto_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint uVar2;
  ParseContext *ptr_00;
  uint64 val_00;
  string *psVar3;
  ulong tag_01;
  ModelProto_SentencePiece *containing_type;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar4;
  float fVar5;
  uint32 *local_68;
  uint64 val;
  string *str;
  uint32 tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  ModelProto_SentencePiece *this_local;
  string *local_28;
  InternalMetadata *local_20;
  uint32 *local_18;
  InternalMetadata *local_10;
  
  local_68 = (uint32 *)((long)&str + 4);
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  local_18 = local_68;
  do {
    *local_68 = 0;
    local_68 = local_68 + 1;
  } while (local_68 != &tag);
LAB_002cbda7:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_002cc078;
    ptr_00 = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,(uint32 *)&str,0)
    ;
    tag_00 = (uint)str;
    if (ptr_00 == (ParseContext *)0x0) goto LAB_002cc096;
    uVar2 = (uint)str >> 3;
    ctx_local = ptr_00;
    if (uVar2 == 1) {
      if (((uint)str & 0xff) != 10) goto LAB_002cbf3f;
      psVar3 = _internal_mutable_piece_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar3,(char *)ctx_local,_tag);
    }
    else {
      if (uVar2 == 2) {
        if (((uint)str & 0xff) == 0x15) {
          _Internal::set_has_score((HasBits *)((long)&str + 4));
          fVar5 = google::protobuf::internal::UnalignedLoad<float>((char *)ctx_local);
          this->score_ = fVar5;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
          goto LAB_002cbda7;
        }
      }
      else if ((uVar2 == 3) && (((uint)str & 0xff) == 0x18)) {
        val_00 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) goto LAB_002cc096;
        bVar1 = ModelProto_SentencePiece_Type_IsValid((ModelProto_SentencePiece_Type)val_00);
        if (bVar1) {
          _internal_set_type(this,(ModelProto_SentencePiece_Type)val_00);
        }
        else {
          psVar3 = mutable_unknown_fields_abi_cxx11_(this);
          google::protobuf::internal::WriteVarint(3,val_00,psVar3);
        }
        goto LAB_002cbda7;
      }
LAB_002cbf3f:
      if ((((uint)str & 7) == 4) || ((uint)str == 0)) {
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&_tag->super_EpsCopyInputStream,(uint)str);
        goto LAB_002cc078;
      }
      if ((uint)str < 0x640) {
        this_local = (ModelProto_SentencePiece *)&(this->super_MessageLite)._internal_metadata_;
        local_20 = (InternalMetadata *)this_local;
        local_10 = (InternalMetadata *)this_local;
        if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
          pCVar4 = google::protobuf::internal::InternalMetadata::
                   PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                             ((InternalMetadata *)this_local);
          local_28 = &pCVar4->unknown_fields;
        }
        else {
          local_28 = google::protobuf::internal::InternalMetadata::
                     mutable_unknown_fields_slow<std::__cxx11::string>
                               ((InternalMetadata *)this_local);
        }
        ctx_local = (ParseContext *)
                    google::protobuf::internal::UnknownFieldParse
                              (tag_00,local_28,(char *)ctx_local,_tag);
      }
      else {
        tag_01 = (ulong)(uint)str;
        containing_type = internal_default_instance();
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ExtensionSet::ParseField
                              (&this->_extensions_,tag_01,(char *)ptr_00,
                               &containing_type->super_MessageLite,
                               &(this->super_MessageLite)._internal_metadata_,_tag);
      }
    }
    if (ctx_local == (ParseContext *)0x0) {
LAB_002cc096:
      ctx_local = (ParseContext *)0x0;
LAB_002cc078:
      google::protobuf::internal::HasBits<1UL>::Or
                (&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* ModelProto_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional float score = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 21)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.ModelProto.SentencePiece.Type type = 3 [default = NORMAL];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::sentencepiece::ModelProto_SentencePiece_Type_IsValid(val))) {
            _internal_set_type(static_cast<::sentencepiece::ModelProto_SentencePiece_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(3, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}